

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O0

void idx2::WriteMetaFile(idx2_file *Idx2,params *P,cstr FileName)

{
  FILE *__stream;
  long *in_FS_OFFSET;
  stref sVar1;
  char local_f8 [8];
  char TransformOrder [128];
  stref DType;
  FILE *Fp;
  cstr FileName_local;
  params *P_local;
  idx2_file *Idx2_local;
  
  __stream = fopen(FileName,"w");
  fprintf(__stream,"(\n");
  fprintf(__stream,"  (common\n");
  fprintf(__stream,"    (type \"Simulation\")\n");
  fprintf(__stream,"    (name \"%s\")\n",&P->Meta);
  fprintf(__stream,"    (field \"%s\")\n",(P->Meta).Field);
  fprintf(__stream,"    (dimensions %d %d %d)\n",(ulong)(uint)(Idx2->Dims3).field_0.field_0.X,
          (ulong)(uint)(Idx2->Dims3).field_0.field_0.Y,(ulong)(uint)(Idx2->Dims3).field_0.field_0.Z)
  ;
  sVar1 = ToString(Idx2->DType);
  snprintf((char *)(*in_FS_OFFSET + -0xf80),(long)(sVar1.Size + 1),"%s",sVar1.field_0.Ptr);
  fprintf(__stream,"    (data-type \"%s\")\n",*in_FS_OFFSET + -0xf80);
  fprintf(__stream,"    (min-max %.20f %.20f)\n",(Idx2->ValueRange).field_0.field_0.X,
          (Idx2->ValueRange).field_0.field_0.Y);
  fprintf(__stream,"    (accuracy %.20f)\n",Idx2->Tolerance);
  fprintf(__stream,"  )\n");
  fprintf(__stream,"  (format\n");
  fprintf(__stream,"    (version %d %d)\n",(ulong)(uint)(Idx2->Version).field_0.field_0.X,
          (ulong)(uint)(Idx2->Version).field_0.field_0.Y);
  fprintf(__stream,"    (brick-size %d %d %d)\n",(ulong)(uint)(Idx2->BrickDims3).field_0.field_0.X,
          (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Y,
          (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Z);
  DecodeTransformOrder(Idx2->TransformOrder,local_f8);
  fprintf(__stream,"    (transform-order \"%s\")\n",local_f8);
  fprintf(__stream,"    (num-levels %d)\n",(ulong)(uint)(int)Idx2->NLevels);
  fprintf(__stream,"    (transform-passes-per-levels %d)\n",1);
  fprintf(__stream,"    (bricks-per-chunk %d)\n",(ulong)(uint)Idx2->BricksPerChunkIn);
  fprintf(__stream,"    (chunks-per-file %d)\n",(ulong)(uint)Idx2->ChunksPerFileIn);
  fprintf(__stream,"    (files-per-directory %d)\n",(ulong)(uint)Idx2->FilesPerDir);
  fprintf(__stream,"    (bit-planes-per-chunk %d)\n",(ulong)(uint)Idx2->BitPlanesPerChunk);
  fprintf(__stream,"  )\n");
  fprintf(__stream,")\n");
  fclose(__stream);
  return;
}

Assistant:

void
WriteMetaFile(const idx2_file& Idx2, const params& P, cstr FileName)
{
  FILE* Fp = fopen(FileName, "w");
  fprintf(Fp, "(\n"); // begin (
  fprintf(Fp, "  (common\n");
  fprintf(Fp, "    (type \"Simulation\")\n"); // TODO: add this config to Idx2
  fprintf(Fp, "    (name \"%s\")\n", P.Meta.Name);
  fprintf(Fp, "    (field \"%s\")\n", P.Meta.Field);
  fprintf(Fp, "    (dimensions %d %d %d)\n", idx2_PrV3i(Idx2.Dims3));
  stref DType = ToString(Idx2.DType);
  fprintf(Fp, "    (data-type \"%s\")\n", idx2_PrintScratchN(Size(DType), "%s", DType.ConstPtr));
  fprintf(Fp, "    (min-max %.20f %.20f)\n", Idx2.ValueRange.Min, Idx2.ValueRange.Max);
  fprintf(Fp, "    (accuracy %.20f)\n", Idx2.Tolerance);
  fprintf(Fp, "  )\n"); // end common)
  fprintf(Fp, "  (format\n");
  fprintf(Fp, "    (version %d %d)\n", Idx2.Version[0], Idx2.Version[1]);
  fprintf(Fp, "    (brick-size %d %d %d)\n", idx2_PrV3i(Idx2.BrickDims3));
  char TransformOrder[128];
  DecodeTransformOrder(Idx2.TransformOrder, TransformOrder);
  fprintf(Fp, "    (transform-order \"%s\")\n", TransformOrder);
  fprintf(Fp, "    (num-levels %d)\n", Idx2.NLevels);
  fprintf(Fp, "    (transform-passes-per-levels %d)\n", Idx2.NTformPasses);
  fprintf(Fp, "    (bricks-per-chunk %d)\n", Idx2.BricksPerChunkIn);
  fprintf(Fp, "    (chunks-per-file %d)\n", Idx2.ChunksPerFileIn);
  fprintf(Fp, "    (files-per-directory %d)\n", Idx2.FilesPerDir);
  fprintf(Fp, "    (bit-planes-per-chunk %d)\n", Idx2.BitPlanesPerChunk);
  fprintf(Fp, "  )\n"); // end format)
  fprintf(Fp, ")\n");   // end )
  fclose(Fp);
}